

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::SearchComponent(BoardView *this)

{
  Searcher *this_00;
  float fVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ImGuiIO *pIVar9;
  ulong uVar10;
  uint uVar11;
  byte local_152;
  char (*local_148) [128];
  bool dummy;
  ulong local_138;
  char (*local_130) [128];
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  results;
  string ui_number;
  string title;
  string searchLabel;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
  local_60;
  
  dummy = true;
  pIVar9 = ImGui::GetIO();
  fVar1 = (pIVar9->DisplaySize).x;
  iVar8 = DPI(100);
  results.first.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44((float)iVar8,fVar1 * 0.5);
  ui_number._M_dataplus._M_p = (pointer)0x3f000000;
  ImGui::SetNextWindowPos((ImVec2 *)&results,0,(ImVec2 *)&ui_number);
  ImGui::PushStyleVar(4,1.0);
  bVar3 = ImGui::BeginPopupModal("Search for Component / Network",&dummy,0x160);
  if (!bVar3) goto LAB_00112ced;
  bVar3 = this->m_showSearch;
  if (bVar3 == true) {
    this->m_showSearch = false;
  }
  local_130 = this->m_search;
  results.first.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar4 = ImGui::Button("Search",(ImVec2 *)&results);
  if (bVar4) {
    SearchCompound(this,*local_130);
    SearchCompoundNoClear(this,this->m_search[1]);
    SearchCompoundNoClear(this,this->m_search[2]);
    CenterZoomSearchResults(this);
    ImGui::CloseCurrentPopup();
  }
  ImGui::SameLine(0.0,-1.0);
  results.first.
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar4 = ImGui::Button("Reset",(ImVec2 *)&results);
  if (bVar4) {
    FindComponent(this,"");
    ResetSearch(this);
  }
  ImGui::SameLine(0.0,-1.0);
  ui_number._M_dataplus._M_p = (pointer)0x0;
  bVar4 = ImGui::Button("Exit",(ImVec2 *)&ui_number);
  if (bVar4) {
LAB_00112812:
    FindComponent(this,"");
    ResetSearch(this);
    ImGui::CloseCurrentPopup();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&results,"CloseDialog",(allocator<char> *)&title);
    bVar4 = KeyBindings::isPressed(&this->keybindings,(string *)&results);
    std::__cxx11::string::~string((string *)&results);
    if (bVar4) goto LAB_00112812;
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::PushItemWidth(-1.0);
  ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");
  ImGui::Separator();
  bVar4 = ImGui::Checkbox("Components",&this->m_searchComponents);
  ImGui::SameLine(0.0,-1.0);
  bVar5 = ImGui::Checkbox("Nets",&this->m_searchNets);
  ImGui::SameLine(0.0,-1.0);
  this_00 = &this->searcher;
  bVar6 = ImGui::Checkbox("Including details",&(this->searcher).m_search_details);
  ImGui::Text(" Search mode: ");
  ImGui::SameLine(0.0,-1.0);
  bVar7 = Searcher::isMode(this_00,Sub);
  bVar7 = ImGui::RadioButton("Substring",bVar7);
  if (bVar7) {
    Searcher::setMode(this_00,Sub);
    local_152 = 1;
  }
  else {
    local_152 = bVar3 | ((bVar4 || bVar5) || bVar6);
  }
  ImGui::SameLine(0.0,-1.0);
  bVar3 = Searcher::isMode(this_00,Prefix);
  bVar3 = ImGui::RadioButton("Prefix",bVar3);
  if (bVar3) {
    Searcher::setMode(this_00,Prefix);
    local_152 = 1;
  }
  ImGui::SameLine(0.0,-1.0);
  ImGui::PushItemWidth(-1.0);
  bVar3 = Searcher::isMode(this_00,Whole);
  bVar3 = ImGui::RadioButton("Whole",bVar3);
  if (bVar3) {
    Searcher::setMode(this_00,Whole);
    local_152 = 1;
  }
  ImGui::PopItemWidth();
  ImGui::Separator();
  ImGui::Columns(3,(char *)0x0,true);
  local_148 = local_130;
  uVar10 = 0;
  while (uVar10 != 3) {
    local_138 = uVar10;
    std::__cxx11::to_string(&ui_number,(int)uVar10 + 1);
    std::operator+(&title,"Item #",&ui_number);
    std::operator+(&searchLabel,"##search",&ui_number);
    ImGui::Text("%s",title._M_dataplus._M_p);
    ImGui::PushItemWidth(-1.0);
    cVar2 = (*local_148)[0];
    SearchPartsAndNets(&results,this,*local_148,0x1e);
    bVar3 = true;
    if (((results.first.
          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          results.first.
          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) && (cVar2 != '\0')) &&
       (results.second.
        super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
        super__Vector_impl_data._M_start ==
        results.second.
        super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      ImGui::PushStyleColor(7,0xff6666ff);
      bVar3 = false;
    }
    bVar4 = ImGui::InputText(searchLabel._M_dataplus._M_p,*local_148,0x80,0x1010,
                             (ImGuiInputTextCallback)0x0,(void *)0x0);
    if (!bVar3) {
      ImGui::PopStyleColor(1);
    }
    bVar3 = ImGui::IsItemActivated();
    if (bVar3) {
      uVar11 = (uint)local_138;
      this->m_active_search_column = uVar11;
      local_152 = 1;
    }
    else {
      uVar11 = this->m_active_search_column;
    }
    if ((bVar4) || (local_138 = uVar10, ((local_152 ^ 1) & 1) == 0 && uVar10 == uVar11)) {
      local_138 = uVar10;
      SearchCompound(this,*local_148);
    }
    ImGui::PopItemWidth();
    bVar3 = ImGui::IsItemDeactivated();
    if (!bVar3 && local_138 == uVar11) {
      bVar3 = ImGui::IsWindowFocused(3);
      if (bVar3) {
        bVar3 = ImGui::IsAnyItemActive();
        if (!bVar3) {
          bVar3 = ImGui::IsMouseClicked(0,false);
          if (!bVar3) {
            ImGui::SetKeyboardFocusHere(-1);
          }
        }
      }
    }
    ImGui::PushItemWidth(-1.0);
    if (cVar2 != '\0') {
      std::operator+(&local_80,"##SC",&ui_number);
      std::
      pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
      ::pair(&local_60,&results);
      SearchColumnGenerate(this,&local_80,&local_60,*local_148,0x1e);
      std::
      pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
      ::~pair(&local_60);
      std::__cxx11::string::~string((string *)&local_80);
    }
    ImGui::PopItemWidth();
    if ((int)local_138 == 2) {
      ImGui::PopItemWidth();
    }
    else if ((int)local_138 == 1) {
      iVar8 = DPI(500);
      ImGui::PushItemWidth((float)iVar8);
    }
    ImGui::NextColumn();
    std::
    pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
    ::~pair(&results);
    std::__cxx11::string::~string((string *)&searchLabel);
    std::__cxx11::string::~string((string *)&title);
    std::__cxx11::string::~string((string *)&ui_number);
    local_148 = local_148 + 1;
    uVar10 = local_138 + 1;
  }
  ImGui::PopItemWidth();
  ImGui::Columns(1,(char *)0x0,true);
  ImGui::Separator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&results,"Accept",(allocator<char> *)&ui_number);
  bVar3 = KeyBindings::isPressed(&this->keybindings,(string *)&results);
  std::__cxx11::string::~string((string *)&results);
  if (bVar3) {
    SearchCompound(this,*local_130);
    SearchCompoundNoClear(this,this->m_search[1]);
    SearchCompoundNoClear(this,this->m_search[2]);
    CenterZoomSearchResults(this);
    ImGui::CloseCurrentPopup();
  }
  ImGui::EndPopup();
LAB_00112ced:
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void BoardView::SearchComponent(void) {
	bool dummy = true;
	ImGui::SetNextWindowPos(ImVec2(ImGui::GetIO().DisplaySize.x/2, DPI(100)), 0, ImVec2(0.5f, 0.0f));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	if (ImGui::BeginPopupModal("Search for Component / Network",
	                           &dummy,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings)) {
		//		char cs[128];
		const char *first_button[] = {m_search[0], m_search[1], m_search[2]};

		bool search_params_changed = m_showSearch; //treat initiail popup reopening similar to later search option changes
		if (m_showSearch) {
			m_showSearch       = false;
			//			fprintf(stderr, "Tooltips disabled\n");
		}

		// Column 1, implied.
		//
		//
		if (ImGui::Button("Search")) {
			// FindComponent(first_button);
			SearchCompound(first_button[0]);
			SearchCompoundNoClear(first_button[1]);
			SearchCompoundNoClear(first_button[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // search button

		ImGui::SameLine();
		if (ImGui::Button("Reset")) {
			FindComponent("");
			ResetSearch();
		} // reset button

		ImGui::SameLine();
		if (ImGui::Button("Exit") || keybindings.isPressed("CloseDialog")) {
			FindComponent("");
			ResetSearch();
			ImGui::CloseCurrentPopup();
		} // exit button

		ImGui::SameLine();
		//		ImGui::Dummy(ImVec2(DPI(200), 1));
		//		ImGui::SameLine();
		ImGui::PushItemWidth(-1);
		ImGui::Text("ENTER: Search, ESC: Exit, TAB: next field");

		{
			ImGui::Separator();
			search_params_changed |= ImGui::Checkbox("Components", &m_searchComponents);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Nets", &m_searchNets);

			ImGui::SameLine();
			search_params_changed |= ImGui::Checkbox("Including details", &searcher.configSearchDetails());

			ImGui::Text(" Search mode: ");
			ImGui::SameLine();
			if (ImGui::RadioButton("Substring", searcher.isMode(SearchMode::Sub))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Sub);
			}
			ImGui::SameLine();
			if (ImGui::RadioButton("Prefix", searcher.isMode(SearchMode::Prefix))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Prefix);
			}
			ImGui::SameLine();
			ImGui::PushItemWidth(-1);
			if (ImGui::RadioButton("Whole", searcher.isMode(SearchMode::Whole))) {
				search_params_changed = true;
				searcher.setMode(SearchMode::Whole);
			}
			ImGui::PopItemWidth();
		}

		ImGui::Separator();

		ImGui::Columns(3);

		for (int i = 0; i < 3; i++) {
			std::string ui_number   = std::to_string(i + 1); // visual UI number is 1-based unlike 0-based indexing
			std::string title       = "Item #" + ui_number;
			std::string searchLabel = "##search" + ui_number;
			ImGui::Text("%s", title.c_str());

			ImGui::PushItemWidth(-1);

			bool textNonEmpty = m_search[i][0] != '\0';                            // Text typed in the search box
			auto results      = SearchPartsAndNets(m_search[i], 30);               // Perform the search for both nets and parts
			bool hasResults   = !results.first.empty() || !results.second.empty(); // We found some nets or some parts

			if (textNonEmpty && !hasResults) ImGui::PushStyleColor(ImGuiCol_FrameBg, 0xFF6666FF);
			bool textChanged =
			    ImGui::InputText(searchLabel.c_str(),
			                     m_search[i],
			                     128,
			                     ImGuiInputTextFlags_CharsNoBlank | (m_search[0] ? ImGuiInputTextFlags_AutoSelectAll : 0));
			if (textNonEmpty && !hasResults) ImGui::PopStyleColor();
			if (ImGui::IsItemActivated()) {
				// user activates another column
				m_active_search_column = i;
				search_params_changed  = true;
			}

			bool this_column_active = i == m_active_search_column;

			if (textChanged || (search_params_changed && this_column_active)) SearchCompound(m_search[i]);

			ImGui::PopItemWidth();

			if (!ImGui::IsItemDeactivated() && this_column_active &&
			    ImGui::IsWindowFocused(ImGuiFocusedFlags_RootAndChildWindows) && !ImGui::IsAnyItemActive() &&
			    !ImGui::IsMouseClicked(0)) {
				ImGui::SetKeyboardFocusHere(-1);
			} // set keyboard focus back to active colun input-text after other type of element was clicked

			ImGui::PushItemWidth(-1);
			if (textNonEmpty) SearchColumnGenerate("##SC" + ui_number, results, m_search[i], 30);
			ImGui::PopItemWidth();
			if (i == 1)
				ImGui::PushItemWidth(DPI(500));
			else if (i == 2)
				ImGui::PopItemWidth();

			ImGui::NextColumn();
		}

		ImGui::PopItemWidth();

		ImGui::Columns(1); // reset back to single column mode
		ImGui::Separator();

		// Enter and Esc close the search:
		if (keybindings.isPressed("Accept")) {
			// SearchCompound(first_button);
			// SearchCompoundNoClear(first_button2);
			// SearchCompoundNoClear(first_button3);
			SearchCompound(m_search[0]);
			SearchCompoundNoClear(m_search[1]);
			SearchCompoundNoClear(m_search[2]);
			CenterZoomSearchResults();
			ImGui::CloseCurrentPopup();
		} // response to keyboard ENTER

		ImGui::EndPopup();
	}
	ImGui::PopStyleVar();
}